

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusAnalyzer.cpp
# Opt level: O1

void __thiscall ModbusAnalyzer::ComputeSampleOffsets(ModbusAnalyzer *this)

{
  Mode MVar1;
  ParityAndStopbits PVar2;
  pointer puVar3;
  ModbusAnalyzerSettings *pMVar4;
  iterator iVar5;
  U32 UVar6;
  int iVar7;
  ClockGenerator clock_generator;
  uint local_34;
  ClockGenerator local_30 [8];
  
  ClockGenerator::ClockGenerator(local_30);
  ClockGenerator::Init((double)((this->mSettings)._M_ptr)->mBitRate,(uint)local_30);
  puVar3 = (this->mSampleOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->mSampleOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_finish != puVar3) {
    (this->mSampleOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  pMVar4 = (this->mSettings)._M_ptr;
  UVar6 = pMVar4->mBitsPerTransfer;
  MVar1 = pMVar4->mModbusMode;
  local_34 = ClockGenerator::AdvanceByHalfPeriod(1.5);
  iVar5._M_current =
       (this->mSampleOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->mSampleOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&this->mSampleOffsets,iVar5,&local_34);
  }
  else {
    *iVar5._M_current = local_34;
    (this->mSampleOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  iVar7 = UVar6 + (MVar1 != Normal) + -1;
  if (iVar7 != 0) {
    do {
      local_34 = ClockGenerator::AdvanceByHalfPeriod(1.0);
      iVar5._M_current =
           (this->mSampleOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->mSampleOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&this->mSampleOffsets,iVar5,&local_34);
      }
      else {
        *iVar5._M_current = local_34;
        (this->mSampleOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  PVar2 = ((this->mSettings)._M_ptr)->mParity;
  if ((PVar2 != NoneTwo) && (PVar2 != NoneOne)) {
    UVar6 = ClockGenerator::AdvanceByHalfPeriod(1.0);
    this->mParityBitOffset = UVar6;
  }
  UVar6 = ClockGenerator::AdvanceByHalfPeriod(1.0);
  this->mStartOfStopBitOffset = UVar6;
  ClockGenerator::~ClockGenerator(local_30);
  return;
}

Assistant:

void ModbusAnalyzer::ComputeSampleOffsets()
{
    ClockGenerator clock_generator;
    clock_generator.Init( mSettings->mBitRate, mSampleRateHz );

    mSampleOffsets.clear();

    U32 num_bits = mSettings->mBitsPerTransfer;

    if( mSettings->mModbusMode != ModbusAnalyzerEnums::Normal )
        num_bits++;

    mSampleOffsets.push_back( clock_generator.AdvanceByHalfPeriod( 1.5 ) ); // point to the center of the 1st bit (past the start bit)
    num_bits--;                                                             // we just added the first bit.

    for( U32 i = 0; i < num_bits; i++ )
    {
        mSampleOffsets.push_back( clock_generator.AdvanceByHalfPeriod() );
    }

    if( mSettings->mParity != ModbusAnalyzerEnums::NoneOne && mSettings->mParity != ModbusAnalyzerEnums::NoneTwo )
        mParityBitOffset = clock_generator.AdvanceByHalfPeriod();

    // to check for framing errors, we also want to check
    // 1/2 bit after the beginning of the stop bit
    mStartOfStopBitOffset = clock_generator.AdvanceByHalfPeriod(
        1.0 ); // i.e. moving from the center of the last data bit (where we left off) to 1/2 period into the stop bit
}